

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  uint uVar1;
  uint uVar2;
  ImGuiTabBar *__src;
  ImGuiTabBar *__dest;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = (this->Buf).Size;
  uVar2 = this->FreeIdx;
  if (uVar2 == uVar1) {
    iVar4 = uVar2 + 1;
    iVar5 = (this->Buf).Capacity;
    iVar3 = iVar4;
    if (iVar5 <= (int)uVar2) {
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar5 * 0x98);
      __src = (this->Buf).Data;
      if (__src != (ImGuiTabBar *)0x0) {
        memcpy(__dest,__src,(long)(this->Buf).Size * 0x98);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar5;
      iVar3 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar4;
    this->FreeIdx = iVar3;
    if ((int)uVar2 < 0) goto LAB_00183faf;
  }
  else {
    if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_00183faf;
    this->FreeIdx = (this->Buf).Data[uVar2].Tabs.Size;
  }
  ImGuiTabBar::ImGuiTabBar((this->Buf).Data + uVar2);
  if ((int)uVar2 < (this->Buf).Size) {
    return (this->Buf).Data + uVar2;
  }
LAB_00183faf:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }